

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syms.c
# Opt level: O2

void sym_set_global(int pass,char *id)

{
  sym_t *psVar1;
  int iVar2;
  sym_t **ppsVar3;
  
  if (pass == 1) {
    return;
  }
  ppsVar3 = &root;
  do {
    psVar1 = *ppsVar3;
    if (psVar1 == (sym_t *)0x0) {
LAB_0010805b:
      err(E,"symbol \'%s\' declared global but not defined",id);
      return;
    }
    iVar2 = strcmp(psVar1->id,id);
    if (iVar2 == 0) {
      if (psVar1->type == _global) {
        err(W,"symbol \'%s\' declared global more than once",id);
      }
      else if (psVar1->type == _extern) goto LAB_0010805b;
      psVar1->type = _global;
      return;
    }
    ppsVar3 = &psVar1->next;
  } while( true );
}

Assistant:

void sym_set_global(int pass, char* id)
{
    sym_t* psym;
    if (pass == READ_PASS)
        return;

    psym = root;
    while (psym)
    {
        if (strcmp(psym->id, id) == 0)
            break;
        psym = psym->next;
    }
    
    if (psym == NULL)
    {
        err(E, "symbol '%s' declared global but not defined", id);
        return;
    }
    
    if (psym->type == _extern)
    {
        err(E, "symbol '%s' declared global but not defined", id);
        return;
    }
    
    if (psym->type == _global)
        err(W, "symbol '%s' declared global more than once", id);
    
    psym->type = _global;
}